

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

float __thiscall QVariant::toFloat(QVariant *this,bool *ok)

{
  float fVar1;
  
  fVar1 = qNumVariantToHelper<float>(&this->d,ok);
  return fVar1;
}

Assistant:

float QVariant::toFloat(bool *ok) const
{
    return qNumVariantToHelper<float>(d, ok);
}